

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_server.cc
# Opt level: O1

void __thiscall
iqxmlrpc::anon_unknown_0::Https_server_connection::send_succeed
          (Https_server_connection *this,bool *terminate)

{
  char *buf;
  bool bVar1;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  std::__cxx11::string::operator=
            ((string *)&(this->super_Server_connection).response,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  if ((this->super_Server_connection).keep_alive == true) {
    buf = (this->super_Server_connection).read_buf_.super__Vector_base<char,_std::allocator<char>_>.
          _M_impl.super__Vector_impl_data._M_start;
    iqnet::ssl::Reaction_connection::reg_recv
              (&this->super_Reaction_connection,buf,
               (long)(this->super_Server_connection).read_buf_.
                     super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                     ._M_finish - (long)buf);
  }
  else {
    bVar1 = iqnet::ssl::Reaction_connection::reg_shutdown(&this->super_Reaction_connection);
    *terminate = bVar1;
  }
  return;
}

Assistant:

void Https_server_connection::send_succeed( bool& terminate )
{
  response = std::string();

  if( keep_alive )
    my_reg_recv();
  else
    terminate = reg_shutdown();
}